

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall
embree::TutorialBenchmark::updateCommandLine(TutorialBenchmark *this,int *argc,char **argv)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  long lVar6;
  pointer __rhs;
  allocator local_9e;
  allocator local_9d;
  int local_9c;
  long local_98;
  char **local_90;
  char **local_88;
  pointer local_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  __rhs = (this->processedCommandLineOptions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->processedCommandLineOptions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = argv + 1;
  do {
    if (__rhs == local_80) {
      return;
    }
    local_90 = local_88;
    local_78 = __rhs;
    for (local_98 = 0; local_98 < *argc; local_98 = local_98 + 1) {
      std::__cxx11::string::string((string *)&local_70,argv[local_98],(allocator *)&local_50);
      _Var1 = std::operator==(&local_70,__rhs);
      std::__cxx11::string::~string((string *)&local_70);
      if (_Var1) {
        iVar4 = 1;
        ppcVar5 = local_90;
        lVar6 = local_98;
        while( true ) {
          lVar6 = lVar6 + 1;
          iVar3 = *argc;
          if (iVar3 <= (int)lVar6) break;
          local_9c = iVar4;
          std::__cxx11::string::string((string *)&local_70,argv[lVar6],&local_9d);
          std::__cxx11::string::string((string *)&local_50,"-",&local_9e);
          bVar2 = startsWith(&local_70,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          if (bVar2) {
            iVar3 = *argc;
            iVar4 = local_9c;
            break;
          }
          iVar4 = local_9c + 1;
          ppcVar5 = ppcVar5 + 1;
        }
        iVar3 = iVar3 - iVar4;
        *argc = iVar3;
        for (lVar6 = local_98; __rhs = local_78, lVar6 < iVar3; lVar6 = lVar6 + 1) {
          argv[lVar6] = *ppcVar5;
          iVar3 = *argc;
          ppcVar5 = ppcVar5 + 1;
        }
      }
      local_90 = local_90 + 1;
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

void TutorialBenchmark::updateCommandLine(int& argc, char** argv)
{
  for (std::string const& str : processedCommandLineOptions)
  {
    for (int i = 0; i < argc; ++i) {
      if (std::string(argv[i]) == str) {
        int remove = 1;
        int j = i+1;
        while(j < argc && !startsWith(std::string(argv[j]), "-")) {
          remove++;
          j++;
        }
        argc -= remove;
        for (j = i; j < argc; ++j) {
          argv[j] = argv[j+remove];
        }
      }
    }
  }
}